

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O0

int nni_pthread_cond_timedwait(pthread_cond_t *c,pthread_mutex_t *m,timespec *ts)

{
  int __errnum;
  char *pcVar1;
  int rv;
  timespec *ts_local;
  pthread_mutex_t *m_local;
  pthread_cond_t *c_local;
  
  __errnum = pthread_cond_timedwait((pthread_cond_t *)c,(pthread_mutex_t *)m,(timespec *)ts);
  if (__errnum == 0) {
    c_local._4_4_ = 0;
  }
  else if ((__errnum == 0xb) || (__errnum == 0x6e)) {
    c_local._4_4_ = 5;
  }
  else {
    pcVar1 = strerror(__errnum);
    nni_panic("pthread_cond_timedwait: %s",pcVar1);
    c_local._4_4_ = 3;
  }
  return c_local._4_4_;
}

Assistant:

static int
nni_pthread_cond_timedwait(
    pthread_cond_t *c, pthread_mutex_t *m, struct timespec *ts)
{
	int rv;

	switch ((rv = pthread_cond_timedwait(c, m, ts))) {
	case 0:
		return (0);
	case ETIMEDOUT:
	case EAGAIN:
		return (NNG_ETIMEDOUT);
	}
	nni_panic("pthread_cond_timedwait: %s", strerror(rv));
	return (NNG_EINVAL);
}